

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O1

void __thiscall UEFITool::UEFITool(UEFITool *this,QWidget *parent)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  UEFITool *pUVar4;
  QClipboard *pQVar5;
  SearchDialog *this_00;
  HexViewDialog *this_01;
  GoToAddressDialog *this_02;
  GoToBaseDialog *this_03;
  EVP_PKEY_CTX *ctx;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QArrayData *local_168;
  char16_t *pcStack_160;
  qsizetype local_158;
  QObject local_150 [8];
  QObject local_148 [8];
  QObject local_140 [8];
  QObject local_138 [8];
  QObject local_130 [8];
  QObject local_128 [8];
  QObject local_120 [8];
  QObject local_118 [8];
  QObject local_110 [8];
  QObject local_108 [8];
  QObject local_100 [8];
  QObject local_f8 [8];
  QObject local_f0 [8];
  QObject local_e8 [8];
  QObject local_e0 [8];
  QObject local_d8 [8];
  QObject local_d0 [8];
  QObject local_c8 [8];
  QObject local_c0 [8];
  QObject local_b8 [8];
  QObject local_b0 [8];
  QObject local_a8 [8];
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QString local_48;
  
  QMainWindow::QMainWindow(&this->super_QMainWindow,parent,0);
  *(undefined ***)this = &PTR_metaObject_002b2008;
  *(undefined ***)&this->field_0x10 = &PTR__UEFITool_002b21c0;
  pUVar4 = (UEFITool *)operator_new(600);
  this->ui = pUVar4;
  (this->currentDir).d.d = (Data *)0x0;
  (this->currentDir).d.ptr = (char16_t *)0x0;
  (this->currentDir).d.size = 0;
  (this->currentPath).d.d = (Data *)0x0;
  (this->currentPath).d.ptr = (char16_t *)0x0;
  (this->currentPath).d.size = 0;
  (this->currentProgramPath).d.d = (Data *)0x0;
  (this->currentProgramPath).d.ptr = (char16_t *)0x0;
  (this->currentProgramPath).d.size = 0;
  QFont::QFont(&this->currentFont);
  QMetaObject::tr((char *)&this->version,(char *)&staticMetaObject,0x1d3014);
  this->markingEnabled = true;
  pQVar5 = (QClipboard *)QGuiApplication::clipboard();
  this->clipboard = pQVar5;
  Ui_UEFITool::setupUi((Ui_UEFITool *)this->ui,&this->super_QMainWindow);
  this_00 = (SearchDialog *)operator_new(0x50);
  SearchDialog::SearchDialog(this_00,(QWidget *)this);
  this->searchDialog = this_00;
  this_01 = (HexViewDialog *)operator_new(0x38);
  HexViewDialog::HexViewDialog(this_01,(QWidget *)this);
  this->hexViewDialog = this_01;
  this_02 = (GoToAddressDialog *)operator_new(0x30);
  GoToAddressDialog::GoToAddressDialog(this_02,(QWidget *)this);
  this->goToAddressDialog = this_02;
  this_03 = (GoToBaseDialog *)operator_new(0x30);
  GoToBaseDialog::GoToBaseDialog(this_03,(QWidget *)this);
  this->goToBaseDialog = this_03;
  this->model = (TreeModel *)0x0;
  this->ffsParser = (FfsParser *)0x0;
  this->ffsFinder = (FfsFinder *)0x0;
  this->ffsReport = (FfsReport *)0x0;
  this->ffsOps = (FfsOperations *)0x0;
  this->ffsBuilder = (FfsBuilder *)0x0;
  QObject::connect(local_50,*(char **)(this->ui + 0x30),(QObject *)"2triggered()",(char *)this,
                   0x1d303b);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  QObject::connect(local_58,*(char **)(this->ui + 0x90),(QObject *)"2triggered()",(char *)this,
                   0x1d304c);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QObject::connect(local_60,*(char **)(this->ui + 0x40),(QObject *)"2triggered()",(char *)this,
                   0x1d3068);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QObject::connect(local_68,*(char **)(this->ui + 0x68),(QObject *)"2triggered()",(char *)this,
                   0x1d3079);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QObject::connect(local_70,*(char **)(this->ui + 0xa8),(QObject *)"2triggered()",(char *)this,
                   0x1d3083);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QObject::connect(local_78,*(char **)(this->ui + 0xb8),(QObject *)"2triggered()",(char *)this,
                   0x1d308e);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  QObject::connect(local_80,*(char **)(this->ui + 0xc0),(QObject *)"2triggered()",(char *)this,
                   0x1d309d);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  QObject::connect(local_88,*(char **)(this->ui + 0x18),(QObject *)"2triggered()",(char *)this,
                   0x1d30b4);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  QObject::connect(local_90,*(char **)(this->ui + 0x20),(QObject *)"2triggered()",(char *)this,
                   0x1d30c3);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  QObject::connect(local_98,*(char **)(this->ui + 0x98),(QObject *)"2triggered()",(char *)this,
                   0x1d30d2);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  QObject::connect(local_a0,*(char **)(this->ui + 0x38),(QObject *)"2triggered()",(char *)this,
                   0x1d30ed);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QObject::connect(local_a8,*(char **)(this->ui + 8),(QObject *)"2triggered()",(char *)this,0x1d30fb
                  );
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  QObject::connect(local_b0,*(char **)this->ui,(QObject *)"2triggered()",(char *)this,0x1d310b);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  QObject::connect(local_b8,*(char **)(this->ui + 0x10),(QObject *)"2triggered()",(char *)this,
                   0x1d311a);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  QObject::connect(local_c0,*(char **)(this->ui + 0x78),(QObject *)"2triggered()",(char *)this,
                   0x1d3129);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  QObject::connect(local_c8,*(char **)(this->ui + 0x28),(QObject *)"2triggered()",(char *)this,
                   0x1d3138);
  QMetaObject::Connection::~Connection((Connection *)local_c8);
  QObject::connect(local_d0,*(char **)(this->ui + 0x48),(QObject *)"2triggered()",(char *)this,
                   0x1d3142);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  QObject::connect(local_d8,*(char **)(this->ui + 0x80),(QObject *)"2triggered()",(char *)this,
                   0x1d314d);
  QMetaObject::Connection::~Connection((Connection *)local_d8);
  QObject::connect(local_e0,*(char **)(this->ui + 0x88),(QObject *)"2triggered()",(char *)this,
                   0x1d315c);
  QMetaObject::Connection::~Connection((Connection *)local_e0);
  QObject::connect(local_e8,*(char **)(this->ui + 0x70),(QObject *)"2triggered()",(char *)this,
                   0x1d316f);
  QMetaObject::Connection::~Connection((Connection *)local_e8);
  QObject::connect(local_f0,*(char **)(this->ui + 0x50),(QObject *)"2triggered()",(char *)this,
                   0x1d3180);
  QMetaObject::Connection::~Connection((Connection *)local_f0);
  QObject::connect(local_f8,*(char **)(this->ui + 0x58),(QObject *)"2triggered()",(char *)this,
                   0x1d3189);
  QMetaObject::Connection::~Connection((Connection *)local_f8);
  QObject::connect(local_100,*(char **)(this->ui + 0x60),(QObject *)"2triggered()",(char *)this,
                   0x1d3194);
  QMetaObject::Connection::~Connection((Connection *)local_100);
  QObject::connect(local_108,*(char **)(this->ui + 0xa0),(QObject *)"2triggered()",(char *)this,
                   0x1d319c);
  QMetaObject::Connection::~Connection((Connection *)local_108);
  QObject::connect(local_110,*(char **)(this->ui + 0xb0),(QObject *)"2triggered()",(char *)this,
                   0x1d31a8);
  QMetaObject::Connection::~Connection((Connection *)local_110);
  QObject::connect(local_118,*(char **)(this->ui + 0xd0),(QObject *)"2triggered()",(char *)this,
                   0x1d31b4);
  QMetaObject::Connection::~Connection((Connection *)local_118);
  QObject::connect(local_120,*(char **)(this->ui + 200),(QObject *)"2triggered()",(char *)this,
                   0x1d31c3);
  QMetaObject::Connection::~Connection((Connection *)local_120);
  QObject::connect(local_128,*(char **)(this->ui + 0xe8),(QObject *)"2triggered()",(char *)this,
                   0x1d31d7);
  QMetaObject::Connection::~Connection((Connection *)local_128);
  QObject::connect(local_130,*(char **)(this->ui + 0xf0),(QObject *)"2triggered()",(char *)this,
                   0x1d31ed);
  QMetaObject::Connection::~Connection((Connection *)local_130);
  QObject::connect(local_138,*(char **)(this->ui + 0xf8),(QObject *)"2triggered()",(char *)this,
                   0x1d3208);
  QMetaObject::Connection::~Connection((Connection *)local_138);
  QObject::connect(local_140,*(char **)(this->ui + 0xe0),(QObject *)"2triggered()",(char *)this,
                   0x1d3221);
  QMetaObject::Connection::~Connection((Connection *)local_140);
  QObject::connect(local_148,*(char **)(this->ui + 0xd8),(QObject *)"2toggled(bool)",(char *)this,
                   0x1d3242);
  QMetaObject::Connection::~Connection((Connection *)local_148);
  QObject::connect(local_150,QCoreApplication::self,(QObject *)"2aboutToQuit()",(char *)this,
                   0x1d326f);
  QMetaObject::Connection::~Connection((Connection *)local_150);
  QWidget::setAcceptDrops(SUB81(this,0));
  QTabWidget::setTabEnabled((int)*(undefined8 *)(this->ui + 0x150),true);
  QVar6.m_data = (storage_type *)0x1;
  QVar6.m_size = (qsizetype)&local_168;
  QString::fromUtf8(QVar6);
  pQVar1 = &((this->currentDir).d.d)->super_QArrayData;
  (this->currentDir).d.d = (Data *)local_168;
  pcVar2 = (this->currentDir).d.ptr;
  (this->currentDir).d.ptr = pcStack_160;
  qVar3 = (this->currentDir).d.size;
  (this->currentDir).d.size = local_158;
  local_168 = pQVar1;
  pcStack_160 = pcVar2;
  local_158 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,8);
    }
  }
  QVar7.m_data = (storage_type *)0xb;
  QVar7.m_size = (qsizetype)&local_168;
  QString::fromUtf8(QVar7);
  local_48.d.d = (Data *)local_168;
  local_48.d.ptr = pcStack_160;
  local_48.d.size = local_158;
  ctx = (EVP_PKEY_CTX *)0x0;
  initGuidDatabase(&local_48,(UINT32 *)0x0);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      ctx = (EVP_PKEY_CTX *)0x2;
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  init(this,ctx);
  readSettings(this);
  return;
}

Assistant:

UEFITool::UEFITool(QWidget *parent) :
QMainWindow(parent),
ui(new Ui::UEFITool),
version(tr(PROGRAM_VERSION)),
markingEnabled(true)
{
    clipboard = QApplication::clipboard();
    
    // Create UI
    ui->setupUi(this);
    searchDialog = new SearchDialog(this);
    hexViewDialog = new HexViewDialog(this);
    goToAddressDialog = new GoToAddressDialog(this);
    goToBaseDialog = new GoToBaseDialog(this);
    model = NULL;
    ffsParser = NULL;
    ffsFinder = NULL;
    ffsOps = NULL;
    ffsBuilder = NULL;
    ffsReport = NULL;
    
    // Connect signals to slots
    connect(ui->actionOpenImageFile, SIGNAL(triggered()), this, SLOT(openImageFile()));
    connect(ui->actionOpenImageFileInNewWindow, SIGNAL(triggered()), this, SLOT(openImageFileInNewWindow()));
    connect(ui->actionSaveImageFile, SIGNAL(triggered()), this, SLOT(saveImageFile()));
    connect(ui->actionSearch, SIGNAL(triggered()), this, SLOT(search()));
    connect(ui->actionHexView, SIGNAL(triggered()), this, SLOT(hexView()));
    connect(ui->actionBodyHexView, SIGNAL(triggered()), this, SLOT(bodyHexView()));
    connect(ui->actionUncompressedHexView, SIGNAL(triggered()), this, SLOT(uncompressedHexView()));
    connect(ui->actionExtract, SIGNAL(triggered()), this, SLOT(extractAsIs()));
    connect(ui->actionExtractBody, SIGNAL(triggered()), this, SLOT(extractBody()));
    connect(ui->actionExtractBodyUncompressed, SIGNAL(triggered()), this, SLOT(extractBodyUncompressed()));
    connect(ui->actionInsertInto, SIGNAL(triggered()), this, SLOT(insertInto()));
    connect(ui->actionInsertBefore, SIGNAL(triggered()), this, SLOT(insertBefore()));
    connect(ui->actionInsertAfter, SIGNAL(triggered()), this, SLOT(insertAfter()));
    connect(ui->actionReplace, SIGNAL(triggered()), this, SLOT(replaceAsIs()));
    connect(ui->actionReplaceBody, SIGNAL(triggered()), this, SLOT(replaceBody()));
    connect(ui->actionRemove, SIGNAL(triggered()), this, SLOT(remove()));
    connect(ui->actionRebuild, SIGNAL(triggered()), this, SLOT(rebuild()));
    connect(ui->actionMessagesCopy, SIGNAL(triggered()), this, SLOT(copyMessage()));
    connect(ui->actionMessagesCopyAll, SIGNAL(triggered()), this, SLOT(copyAllMessages()));
    connect(ui->actionMessagesClear, SIGNAL(triggered()), this, SLOT(clearMessages()));
    connect(ui->actionAbout, SIGNAL(triggered()), this, SLOT(about()));
    connect(ui->actionAboutQt, SIGNAL(triggered()), this, SLOT(aboutQt()));
    connect(ui->actionQuit, SIGNAL(triggered()), this, SLOT(exit()));
    connect(ui->actionGoToData, SIGNAL(triggered()), this, SLOT(goToData()));
    connect(ui->actionGoToBase, SIGNAL(triggered()), this, SLOT(goToBase()));
    connect(ui->actionGoToAddress, SIGNAL(triggered()), this, SLOT(goToAddress()));
    connect(ui->actionLoadGuidDatabase, SIGNAL(triggered()), this, SLOT(loadGuidDatabase()));
    connect(ui->actionUnloadGuidDatabase, SIGNAL(triggered()), this, SLOT(unloadGuidDatabase()));
    connect(ui->actionLoadDefaultGuidDatabase, SIGNAL(triggered()), this, SLOT(loadDefaultGuidDatabase()));
    connect(ui->actionExportDiscoveredGuids, SIGNAL(triggered()), this, SLOT(exportDiscoveredGuids()));
    connect(ui->actionGenerateReport, SIGNAL(triggered()), this, SLOT(generateReport()));
    connect(ui->actionToggleBootGuardMarking, SIGNAL(toggled(bool)), this, SLOT(toggleBootGuardMarking(bool)));
    connect(QCoreApplication::instance(), SIGNAL(aboutToQuit()), this, SLOT(writeSettings()));
    
    // Enable Drag-and-Drop actions
    setAcceptDrops(true);
    
    // Disable Builder tab, doesn't work right now
    ui->messagesTabWidget->setTabEnabled(TAB_BUILDER, false);
    
    // Set current directory
    currentDir = ".";
    
    // Load built-in GUID database
    initGuidDatabase(":/guids.csv");
    
    // Initialize non-persistent data
    init();
    
    // Read stored settings
    readSettings();
}